

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O3

bool __thiscall GenCADFile::parse_components(GenCADFile *this)

{
  uint *puVar1;
  size_type sVar2;
  bool bVar3;
  int lb;
  int iVar4;
  undefined4 uVar5;
  GenCADFile *this_00;
  char *pcVar6;
  mpc_ast_t *pmVar7;
  mpc_ast_t *pmVar8;
  size_t sVar9;
  mpc_ast_t *pmVar10;
  size_t sVar11;
  GenCADFile *pGVar12;
  bool mirror_x;
  bool mirror_y;
  bool flip;
  BRDPart brd_part;
  double local_88;
  BRDPart local_80;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_38;
  
  fill_signals_cache(this);
  lb = mpc_ast_get_index_lb(this->components_ast,"component|>",0);
  if (-1 < lb) {
    local_38 = &(this->super_BRDFileBase).parts;
    do {
      pGVar12 = (GenCADFile *)this->components_ast;
      this_00 = (GenCADFile *)mpc_ast_get_child_lb((mpc_ast_t *)pGVar12,"component|>",lb);
      local_80.name = (char *)0x0;
      local_80.mfgcode._M_dataplus._M_p = (pointer)&local_80.mfgcode.field_2;
      local_80.mfgcode._M_string_length = 0;
      local_80.mfgcode.field_2._M_local_buf[0] = '\0';
      local_80.p1.y = 0;
      local_80.p2.x = 0;
      local_80.p2.y = 0;
      local_80.mounting_side = Both;
      local_80.part_type = SMD;
      local_80.end_of_pins = 0;
      local_80.p1.x = 0;
      pcVar6 = get_nonquoted_or_quoted_string_child(pGVar12,(mpc_ast_t *)this_00,"component_name");
      if (pcVar6 != (char *)0x0) {
        local_80.name = pcVar6;
      }
      pmVar7 = mpc_ast_get_child((mpc_ast_t *)this_00,"place|>");
      if (pmVar7 != (mpc_ast_t *)0x0) {
        pmVar7 = mpc_ast_get_child(pmVar7,"x_y_ref|>");
        if (pmVar7 != (mpc_ast_t *)0x0) {
          x_y_ref_to_brd_point(this,pmVar7,&local_80.p1);
          x_y_ref_to_brd_point(this,pmVar7,&local_80.p2);
        }
      }
      pmVar7 = mpc_ast_get_child((mpc_ast_t *)this_00,"rotation|>");
      pmVar8 = mpc_ast_get_child(pmVar7,"rot|number|regex");
      local_88 = 0.0;
      if (pmVar8 != (mpc_ast_t *)0x0 && pmVar7 != (mpc_ast_t *)0x0) {
        local_88 = atof(pmVar8->contents);
      }
      pmVar7 = mpc_ast_get_child((mpc_ast_t *)this_00,"named_layer|>");
      if (pmVar7 != (mpc_ast_t *)0x0) {
        pmVar7 = mpc_ast_get_child(pmVar7,"layer_name|nonquoted_string|regex");
        if (pmVar7 != (mpc_ast_t *)0x0) {
          pcVar6 = pmVar7->contents;
          iVar4 = strcmp(pcVar6,"TOP");
          if (iVar4 == 0) {
            uVar5 = 2;
          }
          else {
            iVar4 = strcmp(pcVar6,"BOTTOM");
            if (iVar4 != 0) goto LAB_0014caa0;
            uVar5 = 1;
          }
          local_80.mounting_side = uVar5;
        }
      }
LAB_0014caa0:
      pGVar12 = this_00;
      pmVar7 = mpc_ast_get_child((mpc_ast_t *)this_00,"device_|>");
      if (pmVar7 != (mpc_ast_t *)0x0) {
        pcVar6 = get_stringtoend_child(pGVar12,pmVar7,"device_name");
        sVar9 = strlen(pcVar6);
        sVar2 = local_80.mfgcode._M_string_length;
        if (sVar9 != 0) {
          sVar11 = 0;
          do {
            if (pcVar6[sVar11] == ' ') {
              pcVar6[sVar11] = '_';
            }
            sVar11 = sVar11 + 1;
          } while (sVar9 != sVar11);
        }
        if (pcVar6 != (char *)0x0) {
          strlen(pcVar6);
          std::__cxx11::string::_M_replace((ulong)&local_80.mfgcode,0,(char *)sVar2,(ulong)pcVar6);
        }
      }
      pmVar7 = mpc_ast_get_child((mpc_ast_t *)this_00,"shape_|>");
      if (pmVar7 != (mpc_ast_t *)0x0) {
        pcVar6 = get_nonquoted_or_quoted_string_child(this_00,pmVar7,"shape_name");
        if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
          if ((char *)local_80.mfgcode._M_string_length != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_80.mfgcode);
          }
          std::__cxx11::string::append((char *)&local_80.mfgcode);
          pmVar8 = get_shape_by_name(this,pcVar6);
          if (pmVar8 != (mpc_ast_t *)0x0) {
            pmVar10 = mpc_ast_get_child(pmVar7,"mirror|string");
            if (pmVar10 == (mpc_ast_t *)0x0) {
              mirror_x = false;
              mirror_y = false;
            }
            else {
              pcVar6 = pmVar10->contents;
              iVar4 = strcmp(pcVar6,"MIRRORX");
              mirror_x = iVar4 == 0;
              iVar4 = strcmp(pcVar6,"MIRRORY");
              mirror_y = iVar4 == 0;
            }
            pmVar7 = mpc_ast_get_child(pmVar7,"flip|string");
            if (pmVar7 == (mpc_ast_t *)0x0) {
              flip = false;
            }
            else {
              iVar4 = strcmp(pmVar7->contents,"FLIP");
              flip = iVar4 == 0;
            }
            bVar3 = is_shape_smd(this,pmVar8);
            local_80.part_type._0_1_ = !bVar3;
            local_80.part_type._1_3_ = 0;
            parse_shape_pins_to_component(this,&local_80,local_88,mirror_x,mirror_y,flip,pmVar8);
            if (local_80.part_type == ThroughHole) {
              local_80.mounting_side = Both;
              local_80.part_type = ThroughHole;
            }
            local_80.end_of_pins = (this->super_BRDFileBase).num_pins - 1;
          }
        }
      }
      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(local_38,&local_80);
      puVar1 = &(this->super_BRDFileBase).num_parts;
      *puVar1 = *puVar1 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.mfgcode._M_dataplus._M_p != &local_80.mfgcode.field_2) {
        operator_delete(local_80.mfgcode._M_dataplus._M_p,
                        CONCAT71(local_80.mfgcode.field_2._M_allocated_capacity._1_7_,
                                 local_80.mfgcode.field_2._M_local_buf[0]) + 1);
      }
      lb = mpc_ast_get_index_lb(this->components_ast,"component|>",lb + 1);
    } while (-1 < lb);
  }
  return true;
}

Assistant:

bool GenCADFile::parse_components() {
	fill_signals_cache();
	for (int i = 0; i >= 0;) {
		i = mpc_ast_get_index_lb(components_ast, "component|>", i);
		if (i >= 0) {
			mpc_ast_t *component_ast = mpc_ast_get_child_lb(components_ast, "component|>", i);

			BRDPart brd_part;
			char *component_name = get_nonquoted_or_quoted_string_child(component_ast, "component_name");
			if (component_name) {
				brd_part.name = component_name;
			}

			mpc_ast_t *place_ast = mpc_ast_get_child(component_ast, "place|>");
			if (place_ast) {
				mpc_ast_t *pos_ast = mpc_ast_get_child(place_ast, "x_y_ref|>");
				if (pos_ast) {
					x_y_ref_to_brd_point(pos_ast, &brd_part.p1);
					x_y_ref_to_brd_point(pos_ast, &brd_part.p2);
				}
			}

			double component_rotation_angle = 0.0;
			mpc_ast_t *rotation_ast         = mpc_ast_get_child(component_ast, "rotation|>");
			mpc_ast_t *rotation_value_ast   = mpc_ast_get_child(rotation_ast, "rot|number|regex");
			if (rotation_ast && rotation_value_ast) {
				component_rotation_angle = atof(rotation_value_ast->contents);
			}

			mpc_ast_t *layer_ast = mpc_ast_get_child(component_ast, "named_layer|>");
			if (layer_ast) {
				mpc_ast_t *layer_index_ast = mpc_ast_get_child(layer_ast, "layer_name|nonquoted_string|regex");
				if (has_text_content(layer_index_ast, "TOP")) {
					brd_part.mounting_side = BRDPartMountingSide::Top;
				} else if (has_text_content(layer_index_ast, "BOTTOM")) {
					brd_part.mounting_side = BRDPartMountingSide::Bottom;
				}
			}

			mpc_ast_t *component_device_ast = mpc_ast_get_child(component_ast, "device_|>");
			if (component_device_ast) {
				char *dev_name = get_stringtoend_child(component_device_ast, "device_name");
				// workaround for RSI-TRANSLATOR CAMCAD bad COMPONENT -> DEVICE references
				std::replace(dev_name, dev_name + strlen(dev_name), ' ', '_');
				if (dev_name) brd_part.mfgcode = dev_name;
			}

			mpc_ast_t *shape_ref_ast = mpc_ast_get_child(component_ast, "shape_|>");
			if (shape_ref_ast) {
				char *shape_name_str = get_nonquoted_or_quoted_string_child(shape_ref_ast, "shape_name");
				if (shape_name_str && *shape_name_str) {
					if (!brd_part.mfgcode.empty()) {
						brd_part.mfgcode += " SHAPE ";
					}
					brd_part.mfgcode += shape_name_str;
					mpc_ast_t *shape_ast = get_shape_by_name(shape_name_str);
					if (shape_ast) {
						mpc_ast_t *mirror_ast = mpc_ast_get_child(shape_ref_ast, "mirror|string");
						bool mirror_x         = has_text_content(mirror_ast, "MIRRORX");
						bool mirror_y         = has_text_content(mirror_ast, "MIRRORY");
						mpc_ast_t *flip_ast   = mpc_ast_get_child(shape_ref_ast, "flip|string");
						bool flip             = has_text_content(flip_ast, "FLIP");
						brd_part.part_type    = is_shape_smd(shape_ast) ? BRDPartType::SMD : BRDPartType::ThroughHole;
						parse_shape_pins_to_component(&brd_part, component_rotation_angle, mirror_x, mirror_y, flip, shape_ast);
						if ( brd_part.part_type == BRDPartType::ThroughHole ) {
							brd_part.mounting_side = BRDPartMountingSide::Both;
						}
						brd_part.end_of_pins = num_pins - 1;
					}
				}
			}
			parts.push_back(brd_part);
			num_parts++;
			i++;
		}
	}
	return true;
}